

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

string * __thiscall
pbrt::syntactic::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Loc::toString_abi_cxx11_(&local_38,&this->loc);
  std::operator+(&bStack_78,&local_38,": \'");
  std::operator+(&local_58,&bStack_78,&this->text);
  std::operator+(__return_storage_ptr__,&local_58,"\'");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const { return loc.toString() + ": '" + text + "'"; }